

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

void setPrefixPresent(InternalInstruction *insn,uint8_t prefix,uint64_t location)

{
  uint64_t location_local;
  uint8_t prefix_local;
  InternalInstruction *insn_local;
  
  if (prefix == '&') {
    insn->isPrefix26 = true;
    insn->prefix26 = location;
  }
  else if (prefix == '.') {
    insn->isPrefix2e = true;
    insn->prefix2e = location;
  }
  else if (prefix == '6') {
    insn->isPrefix36 = true;
    insn->prefix36 = location;
  }
  else if (prefix == '>') {
    insn->isPrefix3e = true;
    insn->prefix3e = location;
  }
  else if (prefix == 'd') {
    insn->isPrefix64 = true;
    insn->prefix64 = location;
  }
  else if (prefix == 'e') {
    insn->isPrefix65 = true;
    insn->prefix65 = location;
  }
  else if (prefix == 'f') {
    insn->isPrefix66 = true;
    insn->prefix66 = location;
  }
  else if (prefix == 'g') {
    insn->isPrefix67 = true;
    insn->prefix67 = location;
  }
  else if (prefix == 0xf0) {
    insn->isPrefixf0 = true;
    insn->prefixf0 = location;
  }
  else if (prefix == 0xf2) {
    insn->isPrefixf2 = true;
    insn->prefixf2 = location;
  }
  else if (prefix == 0xf3) {
    insn->isPrefixf3 = true;
    insn->prefixf3 = location;
  }
  return;
}

Assistant:

static void setPrefixPresent(struct InternalInstruction *insn,
		uint8_t prefix, uint64_t location)
{
	switch (prefix) {
	case 0x26:
		insn->isPrefix26 = true;
		insn->prefix26 = location;
		break;
	case 0x2e:
		insn->isPrefix2e = true;
		insn->prefix2e = location;
		break;
	case 0x36:
		insn->isPrefix36 = true;
		insn->prefix36 = location;
		break;
	case 0x3e:
		insn->isPrefix3e = true;
		insn->prefix3e = location;
		break;
	case 0x64:
		insn->isPrefix64 = true;
		insn->prefix64 = location;
		break;
	case 0x65:
		insn->isPrefix65 = true;
		insn->prefix65 = location;
		break;
	case 0x66:
		insn->isPrefix66 = true;
		insn->prefix66 = location;
		break;
	case 0x67:
		insn->isPrefix67 = true;
		insn->prefix67 = location;
		break;
	case 0xf0:
		insn->isPrefixf0 = true;
		insn->prefixf0 = location;
		break;
	case 0xf2:
		insn->isPrefixf2 = true;
		insn->prefixf2 = location;
		break;
	case 0xf3:
		insn->isPrefixf3 = true;
		insn->prefixf3 = location;
		break;
	default:
		break;
	}
}